

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_ssat_arm(CPUARMState *env,uint32_t x,uint32_t shift)

{
  uint32_t uVar1;
  int iVar2;
  
  iVar2 = (int)x >> ((byte)shift & 0x1f);
  uVar1 = -1 << ((byte)shift & 0x1f);
  if (iVar2 < 1) {
    if (-2 < iVar2) {
      return x;
    }
  }
  else {
    uVar1 = ~uVar1;
  }
  env->QF = 1;
  return uVar1;
}

Assistant:

uint32_t HELPER(ssat)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    return do_ssat(env, x, shift);
}